

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

ethash_h256_t * ethash_get_seedhash(uint64_t block_number)

{
  ulong in_RSI;
  ethash_h256 *in_RDI;
  uint32_t i;
  uint64_t epochs;
  ethash_h256 *ret;
  undefined4 local_14;
  
  ret = in_RDI;
  ethash_h256_reset((ethash_h256_t *)0x15478a);
  for (local_14 = 0; (ulong)local_14 < in_RSI / 30000; local_14 = local_14 + 1) {
    SHA3_256(ret,in_RDI->b,0x1547c2);
  }
  return ret;
}

Assistant:

ethash_h256_t ethash_get_seedhash(uint64_t block_number)
{
	ethash_h256_t ret;
	ethash_h256_reset(&ret);
	uint64_t const epochs = block_number / ETHASH_EPOCH_LENGTH;
	for (uint32_t i = 0; i < epochs; ++i)
		SHA3_256(&ret, (uint8_t*)&ret, 32);
	return ret;
}